

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

void * delete(hash_table_t *h,uint32 hash,char *key,size_t len)

{
  size_t sVar1;
  void *pvVar2;
  int32 iVar3;
  hash_entry_t *entry;
  hash_entry_s *phVar4;
  hash_entry_s *phVar5;
  size_t sVar6;
  hash_entry_s *phVar7;
  hash_entry_s *phVar8;
  
  if (h->table[hash].key == (char *)0x0) {
    return (void *)0x0;
  }
  phVar7 = h->table + hash;
  if (h->nocase == 0) {
    phVar5 = (hash_entry_s *)0x0;
    do {
      phVar4 = phVar7;
      sVar1 = phVar4->len;
      if (sVar1 == len) {
        phVar8 = phVar4;
        if (sVar1 == 0) break;
        sVar6 = 0;
        while (phVar4->key[sVar6] == key[sVar6]) {
          sVar6 = sVar6 + 1;
          if (sVar1 == sVar6) goto LAB_0010b518;
        }
      }
      phVar7 = phVar4->next;
      phVar5 = phVar4;
      phVar8 = (hash_entry_s *)0x0;
    } while (phVar4->next != (hash_entry_s *)0x0);
  }
  else {
    phVar5 = (hash_entry_t *)0x0;
    do {
      entry = phVar7;
      if ((entry->len == len) && (iVar3 = keycmp_nocase(entry,key), phVar8 = entry, iVar3 == 0))
      break;
      phVar7 = entry->next;
      phVar5 = entry;
      phVar8 = (hash_entry_s *)0x0;
    } while (entry->next != (hash_entry_s *)0x0);
  }
LAB_0010b518:
  if (phVar8 == (hash_entry_s *)0x0) {
    return (void *)0x0;
  }
  pvVar2 = phVar8->val;
  phVar7 = phVar8->next;
  if (phVar5 == (hash_entry_t *)0x0) {
    if (phVar7 == (hash_entry_s *)0x0) {
      phVar8->next = (hash_entry_s *)0x0;
      phVar8->key = (char *)0x0;
      phVar8->len = 0;
      goto LAB_0010b560;
    }
    phVar8->key = phVar7->key;
    phVar8->len = phVar7->len;
    phVar8->val = phVar7->val;
    phVar8->next = phVar7->next;
  }
  else {
    phVar5->next = phVar7;
    phVar7 = phVar8;
  }
  ckd_free(phVar7);
LAB_0010b560:
  h->inuse = h->inuse + -1;
  return pvVar2;
}

Assistant:

static void *
delete(hash_table_t * h, uint32 hash, const char *key, size_t len)
{
    hash_entry_t *entry, *prev;
    void *val;

    prev = NULL;
    entry = &(h->table[hash]);
    if (entry->key == NULL)
        return NULL;

    if (h->nocase) {
        while (entry && ((entry->len != len)
                         || (keycmp_nocase(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }
    else {
        while (entry && ((entry->len != len)
                         || (keycmp_case(entry, key) != 0))) {
            prev = entry;
            entry = entry->next;
        }
    }

    if (entry == NULL)
        return NULL;

    /* At this point, entry will be the one required to be deleted, prev
       will contain the previous entry
     */
    val = entry->val;

    if (prev == NULL) {
        /* That is to say the entry in the hash table (not the chain) matched the key. */
        /* We will then copy the things from the next entry to the hash table */
        prev = entry;
        if (entry->next) {      /* There is a next entry, great, copy it. */
            entry = entry->next;
            prev->key = entry->key;
            prev->len = entry->len;
            prev->val = entry->val;
            prev->next = entry->next;
            ckd_free(entry);
        }
        else {                  /* There is not a next entry, just set the key to null */
            prev->key = NULL;
            prev->len = 0;
            prev->next = NULL;
        }

    }
    else {                      /* This case is simple */
        prev->next = entry->next;
        ckd_free(entry);
    }

    /* Do wiring and free the entry */

    --h->inuse;

    return val;
}